

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.cpp
# Opt level: O0

Node * __thiscall SplayTree::findMin(SplayTree *this,Node *node)

{
  Node *node_local;
  SplayTree *this_local;
  
  if (node == (Node *)0x0) {
    this_local = (SplayTree *)0x0;
  }
  else {
    this_local = (SplayTree *)node;
    if (node->leftChild != (Node *)0x0) {
      this_local = (SplayTree *)findMin(this,node->leftChild);
    }
  }
  return (Node *)this_local;
}

Assistant:

SplayTree::Node *SplayTree::findMin(Node *node) {
    if (node == nullptr) {
        return nullptr;
    } else if (node->leftChild == nullptr) {
        return node;
    } else {
        return findMin(node->leftChild);
    }
}